

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::utils::MixtureIngredient::getSize
          (ChVector<double> *__return_storage_ptr__,MixtureIngredient *this)

{
  double dVar1;
  double dVar2;
  normal_distribution<double> *pnVar3;
  int iVar4;
  result_type rVar5;
  result_type rVar6;
  double dVar7;
  
  pnVar3 = this->m_sizeDist;
  if (pnVar3 == (normal_distribution<double> *)0x0) {
    __return_storage_ptr__->m_data[0] = (this->m_defSize).m_data[0];
    __return_storage_ptr__->m_data[1] = (this->m_defSize).m_data[1];
    dVar7 = (this->m_defSize).m_data[2];
  }
  else {
    dVar7 = (this->m_minSize).m_data[0];
    dVar1 = (this->m_maxSize).m_data[0];
    do {
      if (rengine()::re == '\0') {
        iVar4 = __cxa_guard_acquire(&rengine()::re);
        if (iVar4 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar5 = std::normal_distribution<double>::operator()(pnVar3,rengine()::re,&pnVar3->_M_param);
    } while ((rVar5 < dVar7) || (dVar1 < rVar5));
    pnVar3 = this->m_sizeDist;
    dVar7 = (this->m_minSize).m_data[1];
    dVar1 = (this->m_maxSize).m_data[1];
    do {
      if (rengine()::re == '\0') {
        iVar4 = __cxa_guard_acquire(&rengine()::re);
        if (iVar4 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar6 = std::normal_distribution<double>::operator()(pnVar3,rengine()::re,&pnVar3->_M_param);
    } while ((rVar6 < dVar7) || (dVar1 < rVar6));
    pnVar3 = this->m_sizeDist;
    dVar1 = (this->m_minSize).m_data[2];
    dVar2 = (this->m_maxSize).m_data[2];
    do {
      if (rengine()::re == '\0') {
        iVar4 = __cxa_guard_acquire(&rengine()::re);
        if (iVar4 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      dVar7 = std::normal_distribution<double>::operator()(pnVar3,rengine()::re,&pnVar3->_M_param);
    } while ((dVar7 < dVar1) || (dVar2 < dVar7));
    __return_storage_ptr__->m_data[0] = rVar5;
    __return_storage_ptr__->m_data[1] = rVar6;
  }
  __return_storage_ptr__->m_data[2] = dVar7;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> MixtureIngredient::getSize() {
    if (m_sizeDist)
        return ChVector<>(sampleTruncatedDist<double>(*m_sizeDist, m_minSize.x(), m_maxSize.x()),
                          sampleTruncatedDist<double>(*m_sizeDist, m_minSize.y(), m_maxSize.y()),
                          sampleTruncatedDist<double>(*m_sizeDist, m_minSize.z(), m_maxSize.z()));

    return m_defSize;
}